

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::Add_DoubleHelper
              (double dblLeft,Var addRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  Var aLeft_00;
  double dVar2;
  Var aLeft;
  double sum_1;
  double sum;
  JavascriptNumber *result_local;
  ScriptContext *scriptContext_local;
  Var addRight_local;
  double dblLeft_local;
  
  bVar1 = TaggedInt::Is(addRight);
  if (bVar1) {
    dVar2 = TaggedInt::ToDouble(addRight);
    dblLeft_local =
         (double)JavascriptNumber::ToVarMaybeInPlace(dblLeft + dVar2,scriptContext,result);
  }
  else {
    bVar1 = JavascriptNumber::Is_NoTaggedIntCheck(addRight);
    if (bVar1) {
      dVar2 = JavascriptNumber::GetValue(addRight);
      dblLeft_local =
           (double)JavascriptNumber::ToVarMaybeInPlace(dblLeft + dVar2,scriptContext,result);
    }
    else {
      aLeft_00 = JavascriptNumber::ToVarMaybeInPlace(dblLeft,scriptContext,result);
      dblLeft_local = (double)Add_Full(aLeft_00,addRight,scriptContext);
    }
  }
  return (Var)dblLeft_local;
}

Assistant:

Var inline JavascriptMath::Add_DoubleHelper(double dblLeft, Var addRight, ScriptContext* scriptContext, JavascriptNumber*result)
        {
            if (TaggedInt::Is(addRight))
            {
                double sum =  dblLeft + TaggedInt::ToDouble(addRight);

                return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(addRight))
            {
                double sum = dblLeft + JavascriptNumber::GetValue(addRight);

                return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
            }
            else
            {
                Var aLeft = JavascriptNumber::ToVarMaybeInPlace(dblLeft, scriptContext, result);

                return Add_Full(aLeft, addRight, scriptContext);
            }
        }